

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterface::GetTransitiveDependencies
          (CommandLineInterface *this,FileDescriptor *file,
          flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *already_seen,RepeatedPtrField<google::protobuf::FileDescriptorProto> *output,
          TransitiveDependencyOptions *options)

{
  FileDescriptor *file_00;
  FileDescriptorProto *proto;
  FileDescriptor **key;
  int index;
  FileDescriptor *local_58;
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_50;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>::iterator,_bool>
  local_48;
  
  local_58 = file;
  local_50 = already_seen;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
  ::EmplaceDecomposable::operator()(&local_48,&local_50,&local_58,&local_58);
  if (local_48.second == true) {
    if (0 < local_58->dependency_count_) {
      index = 0;
      do {
        file_00 = FileDescriptor::dependency(local_58,index);
        GetTransitiveDependencies(this,file_00,already_seen,output,options);
        index = index + 1;
      } while (index < local_58->dependency_count_);
    }
    proto = (FileDescriptorProto *)
            internal::RepeatedPtrFieldBase::AddMessageLite
                      (&output->super_RepeatedPtrFieldBase,
                       Arena::DefaultConstruct<google::protobuf::FileDescriptorProto>);
    FileDescriptor::CopyTo(local_58,proto);
    if (options->include_source_code_info != false) {
      FileDescriptor::CopySourceCodeInfoTo(local_58,proto);
    }
    if (options->retain_options == false) {
      StripSourceRetentionOptions(local_58->pool_,proto);
    }
    if (options->include_json_name == true) {
      FileDescriptor::CopyJsonNameTo(local_58,proto);
    }
  }
  return;
}

Assistant:

void CommandLineInterface::GetTransitiveDependencies(
    const FileDescriptor* file,
    absl::flat_hash_set<const FileDescriptor*>* already_seen,
    RepeatedPtrField<FileDescriptorProto>* output,
    const TransitiveDependencyOptions& options) {
  if (!already_seen->insert(file).second) {
    // Already saw this file.  Skip.
    return;
  }

  // Add all dependencies.
  for (int i = 0; i < file->dependency_count(); ++i) {
    GetTransitiveDependencies(file->dependency(i), already_seen, output,
                              options);
  }

  // Add this file.
  FileDescriptorProto* new_descriptor = output->Add();
  file->CopyTo(new_descriptor);
  if (options.include_source_code_info) {
    file->CopySourceCodeInfoTo(new_descriptor);
  }
  if (!options.retain_options) {
    StripSourceRetentionOptions(*file->pool(), *new_descriptor);
  }
  if (options.include_json_name) {
    file->CopyJsonNameTo(new_descriptor);
  }
}